

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_lmb.cpp
# Opt level: O0

size_t LMBCSConversionWorker
                 (UConverterDataLMBCS *extraInfo,ulmbcs_byte_t group,ulmbcs_byte_t *pStartLMBCS,
                 UChar *pUniChar,ulmbcs_byte_t *lastConverterIndex,UBool *groups_tried)

{
  int32_t iVar1;
  UConverterSharedData *pUVar2;
  uint local_58;
  ulmbcs_byte_t firstByte;
  uint32_t value;
  int bytesConverted;
  UConverterSharedData *xcnv;
  ulmbcs_byte_t *pLMBCS;
  UBool *groups_tried_local;
  ulmbcs_byte_t *lastConverterIndex_local;
  UChar *pUniChar_local;
  ulmbcs_byte_t *pStartLMBCS_local;
  UConverterDataLMBCS *pUStack_18;
  ulmbcs_byte_t group_local;
  UConverterDataLMBCS *extraInfo_local;
  
  _value = extraInfo->OptGrpConverter[group];
  xcnv = (UConverterSharedData *)pStartLMBCS;
  pLMBCS = (ulmbcs_byte_t *)groups_tried;
  groups_tried_local = (UBool *)lastConverterIndex;
  lastConverterIndex_local = (ulmbcs_byte_t *)pUniChar;
  pUniChar_local = (UChar *)pStartLMBCS;
  pStartLMBCS_local._7_1_ = group;
  pUStack_18 = extraInfo;
  iVar1 = ucnv_MBCSFromUChar32_63(_value,(uint)(ushort)*pUniChar,&local_58,'\0');
  if (iVar1 < 1) {
    pLMBCS[pStartLMBCS_local._7_1_] = '\x01';
    extraInfo_local = (UConverterDataLMBCS *)0x0;
  }
  else {
    *groups_tried_local = pStartLMBCS_local._7_1_;
    pUVar2 = xcnv;
    if ((pStartLMBCS_local._7_1_ != 0) && (pUStack_18->OptGroup != pStartLMBCS_local._7_1_)) {
      pUVar2 = (UConverterSharedData *)((long)&xcnv->structSize + 1);
      *(byte *)&xcnv->structSize = pStartLMBCS_local._7_1_;
      if ((iVar1 == 1) && (0xf < pStartLMBCS_local._7_1_)) {
        *(byte *)&pUVar2->structSize = pStartLMBCS_local._7_1_;
        pUVar2 = (UConverterSharedData *)((long)&xcnv->structSize + 2);
      }
    }
    xcnv = pUVar2;
    if ((iVar1 == 1) && ((byte)(local_58 >> (((char)iVar1 + -1) * '\b' & 0x1fU)) < 0x20)) {
      extraInfo_local = (UConverterDataLMBCS *)0x0;
    }
    else {
      switch(iVar1) {
      case 4:
        *(char *)&xcnv->structSize = (char)(local_58 >> 0x18);
        xcnv = (UConverterSharedData *)((long)&xcnv->structSize + 1);
      case 3:
        *(char *)&xcnv->structSize = (char)(local_58 >> 0x10);
        xcnv = (UConverterSharedData *)((long)&xcnv->structSize + 1);
      case 2:
        *(char *)&xcnv->structSize = (char)(local_58 >> 8);
        xcnv = (UConverterSharedData *)((long)&xcnv->structSize + 1);
      case 1:
        *(char *)&xcnv->structSize = (char)local_58;
        xcnv = (UConverterSharedData *)((long)&xcnv->structSize + 1);
      default:
        extraInfo_local = (UConverterDataLMBCS *)((long)xcnv - (long)pUniChar_local);
      }
    }
  }
  return (size_t)extraInfo_local;
}

Assistant:

static size_t
LMBCSConversionWorker (
   UConverterDataLMBCS * extraInfo,    /* subconverters, opt & locale groups */
   ulmbcs_byte_t group,                /* The group to try */
   ulmbcs_byte_t  * pStartLMBCS,              /* where to put the results */
   UChar * pUniChar,                   /* The input unicode character */
   ulmbcs_byte_t * lastConverterIndex, /* output: track last successful group used */
   UBool * groups_tried                /* output: track any unsuccessful groups */
)   
{
   ulmbcs_byte_t  * pLMBCS = pStartLMBCS;
   UConverterSharedData * xcnv = extraInfo->OptGrpConverter[group];

   int bytesConverted;
   uint32_t value;
   ulmbcs_byte_t firstByte;

   U_ASSERT(xcnv);
   U_ASSERT(group<ULMBCS_GRP_UNICODE);

   bytesConverted = ucnv_MBCSFromUChar32(xcnv, *pUniChar, &value, FALSE);

   /* get the first result byte */
   if(bytesConverted > 0) {
      firstByte = (ulmbcs_byte_t)(value >> ((bytesConverted - 1) * 8));
   } else {
      /* most common failure mode is an unassigned character */
      groups_tried[group] = TRUE;
      return 0;
   }

   *lastConverterIndex = group;

   /* All initial byte values in lower ascii range should have been caught by now,
      except with the exception group.
    */
   U_ASSERT((firstByte <= ULMBCS_C0END) || (firstByte >= ULMBCS_C1START) || (group == ULMBCS_GRP_EXCEPT));
   
   /* use converted data: first write 0, 1 or two group bytes */
   if (group != ULMBCS_GRP_EXCEPT && extraInfo->OptGroup != group)
   {
      *pLMBCS++ = group;
      if (bytesConverted == 1 && group >= ULMBCS_DOUBLEOPTGROUP_START)
      {
         *pLMBCS++ = group;
      }
   }

  /* don't emit control chars */
   if ( bytesConverted == 1 && firstByte < 0x20 )
      return 0;


   /* then move over the converted data */
   switch(bytesConverted)
   {
   case 4:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 24);
      U_FALLTHROUGH;
   case 3:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 16);
      U_FALLTHROUGH;
   case 2:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 8);
      U_FALLTHROUGH;
   case 1:
      *pLMBCS++ = (ulmbcs_byte_t)value;
      U_FALLTHROUGH;
   default:
      /* will never occur */
      break;
   }

   return (pLMBCS - pStartLMBCS);
}